

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

void __thiscall
helics::FederateInfo::loadInfoFromToml(FederateInfo *this,string *tomlString,bool runArgParser)

{
  string *psVar1;
  undefined8 uVar2;
  size_type sVar3;
  long lVar4;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  string *local_358;
  App *local_350;
  shared_ptr<helics::HelicsConfigJSON> dptr;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  istringstream tstring;
  undefined1 auStack_300 [8];
  code *local_2f8;
  code *local_2f0;
  value doc;
  
  toml::basic_value<toml::type_config>::basic_value(&doc);
  fileops::loadToml((value *)&tstring,(string *)tomlString);
  local_358 = tomlString;
  toml::basic_value<toml::type_config>::operator=(&doc,(basic_value<toml::type_config> *)&tstring);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&tstring);
  local_328._8_8_ = 0;
  local_310 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:974:68)>
              ::_M_invoke;
  local_318 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:974:68)>
              ::_M_manager;
  local_350 = (App *)this;
  local_328._M_unused._M_object = this;
  for (lVar4 = 0x18; lVar4 != 0x690; lVar4 = lVar4 + 0x18) {
    if (*(int *)(propStringsTranslations + lVar4) < 0xc9) {
      _tstring = &local_2f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&tstring,*(long *)((long)&PTR_what_00448898 + lVar4),
                 *(long *)((long)&PTR__format_error_00448890 + lVar4) +
                 *(long *)((long)&PTR_what_00448898 + lVar4));
      fileops::callIfMember
                (&doc,(string *)&tstring,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
                  *)&local_328);
      std::__cxx11::string::~string((string *)&tstring);
    }
  }
  _tstring = (element_type *)0x0;
  auStack_300 = (undefined1  [8])0x0;
  local_2f0 = CLI::std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:988:9)>
              ::_M_invoke;
  local_2f8 = CLI::std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:988:9)>
              ::_M_manager;
  dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_378._8_8_ = 0;
  local_378._M_unused._M_object = local_350;
  local_360 = CLI::std::
              _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:990:9)>
              ::_M_invoke;
  local_368 = CLI::std::
              _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:990:9)>
              ::_M_manager;
  processOptions(&doc,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&tstring,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&dptr,(function<void_(int,_int)> *)&local_378);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_378);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&dptr);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&tstring);
  if (runArgParser) {
    makeCLIApp((FederateInfo *)&local_378);
    local_378._M_unused._M_function_pointer[0x48] = (_func_void)0x1;
    std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>((shared_ptr<CLI::Config> *)&tstring);
    uVar2 = _tstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_tstring;
    dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_300;
    _tstring = (element_type *)0x0;
    auStack_300 = (undefined1  [8])0x0;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_300);
    psVar1 = local_358;
    if ((element_type *)uVar2 != (element_type *)0x0) {
      *(bool *)(uVar2 + 0x50) = true;
    }
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(local_358,'=',0);
    if (sVar3 == 0xffffffffffffffff) {
      std::ifstream::ifstream(&tstring,(string *)psVar1,_S_in);
      CLI::App::parse_from_stream((App *)local_378._M_unused._0_8_,(istream *)&tstring);
      std::ifstream::~ifstream(&tstring);
    }
    else {
      std::__cxx11::istringstream::istringstream((istringstream *)&tstring,(string *)psVar1,_S_in);
      CLI::App::parse_from_stream((App *)local_378._M_unused._0_8_,(istream *)&tstring);
      std::__cxx11::istringstream::~istringstream((istringstream *)&tstring);
    }
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dptr.super___shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((App *)local_378._M_unused._0_8_ != (App *)0x0) {
      (**(code **)(*local_378._M_unused._M_object + 8))();
    }
  }
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_328);
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  return;
}

Assistant:

void FederateInfo::loadInfoFromToml(const std::string& tomlString, bool runArgParser)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }

    const std::function<void(const std::string&, Time)> timeCall = [this](const std::string& fname,
                                                                          Time arg) {
        setProperty(propStringsTranslations.at(fname), arg);
    };

    for (const auto& prop : propStringsTranslations) {
        if (prop.second > 200) {
            continue;
        }
        fileops::callIfMember(doc, std::string(prop.first.data(), prop.first.size()), timeCall);
    }

    processOptions(
        doc,
        [](const std::string& option) { return getFlagIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [this](int32_t option, int32_t value) { setFlagOption(option, value != 0); });

    if (runArgParser) {
        auto app = makeCLIApp();
        app->allow_extras();
        auto dptr = std::static_pointer_cast<HelicsConfigJSON>(app->get_config_formatter_base());
        if (dptr) {
            dptr->skipJson(true);
        }
        try {
            if (tomlString.find('=') != std::string::npos) {
                std::istringstream tstring(tomlString);
                app->parse_from_stream(tstring);
            } else {
                std::ifstream file(tomlString);
                app->parse_from_stream(file);
            }
        }
        catch (const CLI::Error& e) {
            throw(InvalidIdentifier(e.what()));
        }
    }
}